

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseStringFlag(char *str,char *flag,string *value)

{
  char *pcVar1;
  char *value_str;
  string *value_local;
  char *flag_local;
  char *str_local;
  
  pcVar1 = ParseFlagValue(str,flag,false);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)value,pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

static bool ParseStringFlag(const char* str,
                            const char* flag,
                            std::string* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}